

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcpclient.cpp
# Opt level: O1

void __thiscall uv::TCPClient::send_inl(TCPClient *this,uv_write_t *req)

{
  size_t *psVar1;
  uv_mutex_t *puVar2;
  undefined8 *puVar3;
  char *pcVar4;
  long lVar5;
  FILE *__stream;
  uint uVar6;
  int errcode;
  uint uVar7;
  int iVar8;
  int iVar9;
  _List_node_base *p_Var10;
  ssize_t sVar11;
  _List_node_base *p_Var12;
  ILog4zManager *pIVar13;
  undefined8 uVar14;
  size_t in_RCX;
  char *pcVar15;
  int iVar16;
  ulong uVar17;
  long *in_FS_OFFSET;
  string local_50;
  
  if (req != (uv_write_t *)0x0) {
    if ((this->writeparam_list_).
        super__List_base<uv::_write_param_*,_std::allocator<uv::_write_param_*>_>._M_impl._M_node.
        _M_size < 0x15) {
      p_Var12 = (_List_node_base *)operator_new(0x18);
      p_Var12[1]._M_next = (_List_node_base *)req;
      std::__detail::_List_node_base::_M_hook(p_Var12);
      psVar1 = &(this->writeparam_list_).
                super__List_base<uv::_write_param_*,_std::allocator<uv::_write_param_*>_>._M_impl.
                _M_node._M_size;
      *psVar1 = *psVar1 + 1;
    }
    else {
      free(req[1].data);
      free(req);
    }
  }
  puVar2 = &this->mutex_writebuf_;
  uv_mutex_lock(puVar2);
  if ((this->write_circularbuf_).m_bEmpty == false) {
    lVar5 = *in_FS_OFFSET;
    puVar3 = (undefined8 *)(lVar5 + -0x800);
    pcVar4 = (char *)(lVar5 + -1);
    do {
      p_Var12 = (this->writeparam_list_).
                super__List_base<uv::_write_param_*,_std::allocator<uv::_write_param_*>_>._M_impl.
                _M_node.super__List_node_base._M_next;
      if (p_Var12 == (_List_node_base *)&this->writeparam_list_) {
        p_Var10 = (_List_node_base *)malloc(0xd8);
        p_Var12 = (_List_node_base *)malloc(0x2800);
        p_Var10[0xc]._M_next = p_Var12;
        p_Var10[0xc]._M_prev = (_List_node_base *)0x2800;
        *(undefined4 *)&p_Var10[0xd]._M_next = 0x2800;
        p_Var10->_M_next = (_List_node_base *)this;
      }
      else {
        p_Var10 = p_Var12[1]._M_next;
        psVar1 = &(this->writeparam_list_).
                  super__List_base<uv::_write_param_*,_std::allocator<uv::_write_param_*>_>._M_impl.
                  _M_node._M_size;
        *psVar1 = *psVar1 - 1;
        std::__detail::_List_node_base::_M_unhook();
        operator_delete(p_Var12,0x18);
      }
      sVar11 = PodCircularBuffer<char>::read
                         (&this->write_circularbuf_,(int)p_Var10[0xc]._M_next,
                          (void *)(ulong)*(uint *)&p_Var10[0xd]._M_next,in_RCX);
      p_Var10[0xc]._M_prev = (_List_node_base *)(long)(int)sVar11;
      uv_mutex_unlock(puVar2);
      in_RCX = 1;
      errcode = uv_write(p_Var10,this->client_handle_,p_Var10 + 0xc,1,AfterSend);
      if (errcode != 0) {
        p_Var12 = (_List_node_base *)operator_new(0x18);
        p_Var12[1]._M_next = p_Var10;
        std::__detail::_List_node_base::_M_hook(p_Var12);
        psVar1 = &(this->writeparam_list_).
                  super__List_base<uv::_write_param_*,_std::allocator<uv::_write_param_*>_>._M_impl.
                  _M_node._M_size;
        *psVar1 = *psVar1 + 1;
        *puVar3 = 0x28746e65696c63;
        uVar7 = snprintf((char *)(lVar5 + -0x7f9),0x7f9,"%016llx",this);
        pcVar15 = (char *)(lVar5 + -0x7f9);
        uVar6 = 0;
        if ((int)uVar7 < 0) {
LAB_0011c33c:
          uVar7 = uVar6;
          *pcVar15 = '\0';
        }
        else {
          pcVar15 = pcVar4;
          uVar6 = 0x7f9;
          if (0x7f8 < (int)uVar7) goto LAB_0011c33c;
        }
        uVar17 = (ulong)(uVar7 + 7);
        if (uVar7 < 0x7f9) {
          iVar16 = 0x800 - (uVar7 + 7);
          iVar8 = snprintf((char *)(uVar17 + (long)puVar3),(long)iVar16,"%s",") send error:");
          pcVar15 = (char *)(uVar17 + (long)puVar3);
          iVar9 = 0;
          if ((iVar8 < 0) || (pcVar15 = pcVar4, iVar9 = iVar16, iVar16 <= iVar8)) {
            iVar8 = iVar9;
            *pcVar15 = '\0';
          }
          uVar17 = uVar17 + (long)iVar8;
        }
        GetUVError_abi_cxx11_(&local_50,errcode);
        if ((long)uVar17 < 0x800) {
          iVar16 = 0x800 - (int)uVar17;
          iVar8 = snprintf((char *)(uVar17 + (long)puVar3),(long)iVar16,"%s",
                           local_50._M_dataplus._M_p);
          pcVar15 = (char *)(uVar17 + (long)puVar3);
          iVar9 = 0;
          if ((iVar8 < 0) || (pcVar15 = pcVar4, iVar9 = iVar16, iVar16 <= iVar8)) {
            iVar8 = iVar9;
            *pcVar15 = '\0';
          }
          uVar17 = uVar17 + (long)iVar8;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        if ((long)uVar17 < 0x800) {
          iVar16 = 0x800 - (int)uVar17;
          iVar8 = snprintf((char *)(uVar17 + (long)puVar3),(long)iVar16,"%s"," ( ");
          pcVar15 = (char *)(uVar17 + (long)puVar3);
          iVar9 = 0;
          if ((iVar8 < 0) || (pcVar15 = pcVar4, iVar9 = iVar16, iVar16 <= iVar8)) {
            iVar8 = iVar9;
            *pcVar15 = '\0';
          }
          uVar17 = uVar17 + (long)iVar8;
        }
        if ((long)uVar17 < 0x800) {
          iVar16 = 0x800 - (int)uVar17;
          iVar8 = snprintf((char *)(uVar17 + (long)puVar3),(long)iVar16,"%s"," ");
          pcVar15 = (char *)(uVar17 + (long)puVar3);
          iVar9 = 0;
          if ((iVar8 < 0) || (pcVar15 = pcVar4, iVar9 = iVar16, iVar16 <= iVar8)) {
            iVar8 = iVar9;
            *pcVar15 = '\0';
          }
          uVar17 = uVar17 + (long)iVar8;
        }
        if ((long)uVar17 < 0x800) {
          iVar16 = 0x800 - (int)uVar17;
          iVar8 = snprintf((char *)(uVar17 + (long)puVar3),(long)iVar16,"%s"," ) : ");
          pcVar15 = (char *)(uVar17 + (long)puVar3);
          iVar9 = 0;
          if ((iVar8 < 0) || (pcVar15 = pcVar4, iVar9 = iVar16, iVar16 <= iVar8)) {
            iVar8 = iVar9;
            *pcVar15 = '\0';
          }
          uVar17 = uVar17 + (long)iVar8;
        }
        if ((long)uVar17 < 0x800) {
          iVar8 = 0x800 - (int)uVar17;
          iVar9 = snprintf((char *)(uVar17 + (long)puVar3),(long)iVar8,"%d",0x1e9);
          pcVar15 = (char *)(uVar17 + (long)puVar3);
          if ((iVar9 < 0) || (pcVar15 = pcVar4, iVar8 <= iVar9)) {
            *pcVar15 = '\0';
          }
        }
        pIVar13 = zsummer::log4z::ILog4zManager::GetInstance();
        (*pIVar13->_vptr_ILog4zManager[8])(pIVar13,0,3,puVar3);
        __stream = _stdout;
        uVar14 = uv_err_name(errcode);
        in_RCX = uv_strerror(errcode);
        fprintf(__stream,"send error. %s-%s\n",uVar14);
      }
      uv_mutex_lock(puVar2);
    } while ((this->write_circularbuf_).m_bEmpty == false);
  }
  uv_mutex_unlock(puVar2);
  return;
}

Assistant:

void TCPClient::send_inl(uv_write_t* req /*= NULL*/)
{
    write_param* writep = (write_param*)req;
    if (writep) {
        if (writeparam_list_.size() > MAXLISTSIZE) {
            FreeWriteParam(writep);
        } else {
            writeparam_list_.push_back(writep);
        }
    }
    while (true) {
        uv_mutex_lock(&mutex_writebuf_);
        if (write_circularbuf_.empty()) {
            uv_mutex_unlock(&mutex_writebuf_);
            break;
        }
        if (writeparam_list_.empty()) {
            writep = AllocWriteParam();
            writep->write_req_.data = this;
        } else {
            writep = writeparam_list_.front();
            writeparam_list_.pop_front();
        }
        writep->buf_.len = write_circularbuf_.read(writep->buf_.base, writep->buf_truelen_); 
        uv_mutex_unlock(&mutex_writebuf_);
        int iret = uv_write((uv_write_t*)&writep->write_req_, (uv_stream_t*)&client_handle_->tcphandle, &writep->buf_, 1, AfterSend);
        if (iret) {
            writeparam_list_.push_back(writep);//failure not call AfterSend. so recycle req
            LOGE("client(" << this << ") send error:" << GetUVError(iret));
            fprintf(stdout, "send error. %s-%s\n", uv_err_name(iret), uv_strerror(iret));
        }
    }
}